

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_utils.h
# Opt level: O2

bool Gudhi::read_simplex<int,double>
               (istream *in_,vector<int,_std::allocator<int>_> *simplex,double *fil)

{
  long *plVar1;
  istream *piVar2;
  int i;
  int iVar3;
  int dim;
  int v;
  
  dim = 0;
  plVar1 = (long *)std::istream::operator>>(in_,&dim);
  iVar3 = 0;
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
    for (; iVar3 <= dim; iVar3 = iVar3 + 1) {
      plVar1 = (long *)std::istream::operator>>(in_,&v);
      if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) goto LAB_0010ac3c;
      std::vector<int,_std::allocator<int>_>::push_back(simplex,&v);
    }
    piVar2 = std::istream::_M_extract<double>((double *)in_);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
      std::istream::ignore((long)in_,-1);
      iVar3 = 1;
    }
    else {
LAB_0010ac3c:
      iVar3 = 0;
    }
  }
  return SUB41(iVar3,0);
}

Assistant:

bool read_simplex(std::istream& in_, std::vector<Vertex_handle>& simplex, Filtration_value& fil) {
  int dim = 0;
  if (!(in_ >> dim)) return false;
  Vertex_handle v;
  for (int i = 0; i < dim + 1; ++i) {
    if (!(in_ >> v)) return false;
    simplex.push_back(v);
  }
  if (!(in_ >> fil)) return false;
  in_.ignore((std::numeric_limits<std::streamsize>::max)(), '\n');  // ignore until the carriage return
  return true;
}